

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeMessageSetItem
                    (FieldDescriptor *field,Message *message,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  int cached_size;
  uint8_t *puVar1;
  MessageLite *this;
  Metadata MVar2;
  
  MVar2 = Message::GetMetadata(message);
  puVar1 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
  puVar1 = io::CodedOutputStream::WriteVarint32ToArray(0xb,puVar1);
  puVar1 = WireFormatLite::WriteUInt32ToArray(2,field->number_,puVar1);
  this = &Reflection::GetMessage(MVar2.reflection,message,field,(MessageFactory *)0x0)->
          super_MessageLite;
  cached_size = MessageLite::GetCachedSize(this);
  puVar1 = WireFormatLite::InternalWriteMessage(3,this,cached_size,puVar1,stream);
  puVar1 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar1);
  puVar1 = io::CodedOutputStream::WriteVarint32ToArray(0xc,puVar1);
  return puVar1;
}

Assistant:

uint8_t* WireFormat::InternalSerializeMessageSetItem(
    const FieldDescriptor* field, const Message& message, uint8_t* target,
    io::EpsCopyOutputStream* stream) {
  const Reflection* message_reflection = message.GetReflection();

  target = stream->EnsureSpace(target);
  // Start group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemStartTag, target);
  // Write type ID.
  target = WireFormatLite::WriteUInt32ToArray(
      WireFormatLite::kMessageSetTypeIdNumber, field->number(), target);
    // Write message.
    auto& msg = message_reflection->GetMessage(message, field);
    target = WireFormatLite::InternalWriteMessage(
        WireFormatLite::kMessageSetMessageNumber, msg, msg.GetCachedSize(),
        target, stream);
  // End group.
  target = stream->EnsureSpace(target);
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemEndTag, target);
  return target;
}